

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_SetPropertyInternal(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  byte bVar1;
  JSShape *pJVar2;
  JSValueUnion JVar3;
  JSClassExoticMethods *pJVar4;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *p_Var5;
  _func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *p_Var6;
  JSValue getter;
  JSValue val_00;
  JSValue getter_00;
  JSValue setter;
  JSValue setter_00;
  int iVar7;
  int iVar8;
  JSRefCountHeader *p_10;
  JSValueUnion *pJVar9;
  uint uVar10;
  JSToNumberHintEnum flag;
  JSProperty *pr;
  char *pcVar11;
  JSValueUnion JVar12;
  JSRuntime *rt;
  JSValueUnion JVar13;
  JSObject **ppJVar14;
  JSValueUnion JVar15;
  JSRefCountHeader *p_4;
  uint uVar16;
  JSRefCountHeader *p_1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar17;
  JSValue v_02;
  JSValue v_03;
  JSValue JVar18;
  JSValue JVar19;
  JSPropertyDescriptor desc;
  undefined4 in_stack_ffffffffffffff14;
  JSValueUnion local_c0;
  JSPropertyDescriptor local_a8;
  undefined4 local_70;
  uint uStack_6c;
  undefined8 uStack_68;
  undefined4 local_60;
  uint uStack_5c;
  undefined8 uStack_58;
  undefined4 local_50;
  uint uStack_4c;
  undefined8 uStack_48;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  JVar15 = (JSValueUnion)val.tag;
  JVar13 = val.u;
  JVar18.tag = (JSValueUnion)this_obj.tag;
  JVar12 = this_obj.u;
  iVar7 = (int)this_obj.tag;
  uVar16 = (uint)val.tag;
  if (iVar7 == -1) {
    do {
      pJVar2 = *(JSShape **)((long)JVar12.ptr + 0x18);
      uVar10 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      while( true ) {
        pr = (JSProperty *)(ulong)uVar10;
        local_c0 = JVar12;
        if (uVar10 == 0) goto LAB_0011d9e7;
        ppJVar14 = &pJVar2->proto + (long)pr;
        if (*(JSAtom *)((long)&pJVar2->proto + (long)pr * 8 + 4) == prop) break;
        uVar10 = *(uint *)ppJVar14 & 0x3ffffff;
      }
      pJVar9 = (JSValueUnion *)
               (*(JSProperty **)((long)JVar12.ptr + 0x20) + (long)&pr[-1].u.var_ref + 0xf);
      uVar10 = *(uint *)ppJVar14;
      if ((uVar10 & 0xe8000000) == 0x8000000) {
        JVar12.ptr = pJVar9->ptr;
        JVar3 = pJVar9[1];
        pJVar9->ptr = (void *)JVar13;
        pJVar9[1].ptr = (void *)JVar15;
        iVar8 = 1;
        if ((uint)JVar3.int32 < 0xfffffff5) {
          return 1;
        }
        iVar7 = *JVar12.ptr;
        *(int *)JVar12.ptr = iVar7 + -1;
        if (1 < iVar7) {
          return 1;
        }
        rt = ctx->rt;
        JVar15 = JVar3;
        JVar13.ptr = JVar12.ptr;
        goto LAB_0011d895;
      }
      if ((uVar10 >> 0x1d & 1) != 0) {
        iVar7 = set_array_length(ctx,(JSObject *)JVar12.ptr,val,flags);
        return iVar7;
      }
      if (uVar10 >> 0x1e != 3) {
        if (uVar10 >> 0x1e != 0) {
          if (uVar10 >> 0x1e != 2) {
            iVar7 = call_setter(ctx,(JSObject *)pJVar9[1].ptr,this_obj,val,flags);
            return iVar7;
          }
          if (*(short *)((long)JVar12.ptr + 6) != 0xb) {
            set_value(ctx,*(JSValue **)((long)pJVar9->ptr + 0x18),val);
            return 1;
          }
        }
        goto LAB_0011dcbc;
      }
      iVar7 = JS_AutoInitProperty(ctx,(JSObject *)JVar12.ptr,prop,(JSProperty *)pJVar9,
                                  (JSShapeProperty *)ppJVar14);
    } while (iVar7 == 0);
    iVar8 = -1;
LAB_0011dc10:
    if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2))
    {
      rt = ctx->rt;
LAB_0011d895:
      v.tag = (int64_t)JVar15.ptr;
      v.u.ptr = JVar13.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  else {
    if (iVar7 == 3) {
      if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2)
         ) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      pcVar11 = "cannot set property \'%s\' of undefined";
    }
    else {
      if (iVar7 != 2) {
        JVar18.u.ptr = (void *)JVar18.tag;
        JVar18 = JS_GetPrototypePrimitive(ctx,JVar18);
        JVar12 = JVar18.u;
        local_c0.float64 = 0.0;
        goto LAB_0011d9fb;
      }
      if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2)
         ) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      pcVar11 = "cannot set property \'%s\' of null";
    }
    __JS_ThrowTypeErrorAtom(ctx,prop,pcVar11);
LAB_0011d92f:
    iVar8 = -1;
  }
  return iVar8;
LAB_0011d9e7:
  flag = (JSToNumberHintEnum)pr;
  if ((*(byte *)((long)JVar12.ptr + 5) & 4) == 0) goto LAB_0011d9f3;
  if ((*(byte *)((long)JVar12.ptr + 5) & 8) == 0) {
    pJVar4 = ctx->rt->class_array[*(ushort *)((long)JVar12.ptr + 6)].exotic;
    if (pJVar4 != (JSClassExoticMethods *)0x0) {
      p_Var5 = pJVar4->set_property;
      if (p_Var5 != (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *)0x0) {
        *(int *)JVar12.ptr = *JVar12.ptr + 1;
        JVar17.tag = -1;
        JVar17.u.ptr = JVar12.ptr;
        iVar8 = (*p_Var5)(ctx,JVar17,prop,val,this_obj,flags);
        iVar7 = *JVar12.ptr;
        *(int *)JVar12.ptr = iVar7 + -1;
        if (iVar7 < 2) {
          v_02.tag = -1;
          v_02.u.ptr = JVar12.ptr;
          __JS_FreeValueRT(ctx->rt,v_02);
        }
        goto LAB_0011df14;
      }
      p_Var6 = pJVar4->get_own_property;
      if (p_Var6 == (_func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *)0x0)
      goto LAB_0011d9f3;
      *(int *)JVar12.ptr = *JVar12.ptr + 1;
      JVar19.tag = -1;
      JVar19.u.ptr = JVar12.ptr;
      iVar8 = (*p_Var6)(ctx,&local_a8,JVar19,prop);
      iVar7 = *JVar12.ptr;
      *(int *)JVar12.ptr = iVar7 + -1;
      if (iVar7 < 2) {
        v_00.tag = -1;
        v_00.u.ptr = JVar12.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if (iVar8 < 0) goto LAB_0011dc10;
      if (iVar8 != 0) {
        if ((local_a8.flags & 0x10U) != 0) {
          JVar12 = local_a8.setter.u;
          if ((uint)local_a8.setter.tag == 3) {
            JVar12.float64 = 0.0;
          }
          iVar8 = call_setter(ctx,(JSObject *)JVar12.ptr,this_obj,val,flags);
          if ((0xfffffff4 < (uint)local_a8.getter.tag) &&
             (iVar7 = *local_a8.getter.u.ptr, *(int *)local_a8.getter.u.ptr = iVar7 + -1, iVar7 < 2)
             ) {
            v_03.tag = local_a8.getter.tag;
            v_03.u.ptr = local_a8.getter.u.ptr;
            __JS_FreeValueRT(ctx->rt,v_03);
          }
          JVar15._4_4_ = local_a8.setter.tag._4_4_;
          JVar15.int32 = (uint)local_a8.setter.tag;
          if ((uint)local_a8.setter.tag < 0xfffffff5) {
            return iVar8;
          }
          iVar7 = *local_a8.setter.u.ptr;
          *(int *)local_a8.setter.u.ptr = iVar7 + -1;
          if (1 < iVar7) {
            return iVar8;
          }
          rt = ctx->rt;
          JVar13 = local_a8.setter.u;
          goto LAB_0011d895;
        }
        if ((0xfffffff4 < (uint)local_a8.value.tag) &&
           (iVar7 = *local_a8.value.u.ptr, *(int *)local_a8.value.u.ptr = iVar7 + -1, iVar7 < 2)) {
          v_01.tag = local_a8.value.tag;
          v_01.u.ptr = local_a8.value.u.ptr;
          __JS_FreeValueRT(ctx->rt,v_01);
        }
        if ((local_a8.flags & 2U) != 0) {
          if (local_c0.ptr != JVar12.ptr) goto LAB_0011dd92;
          local_40 = 0;
          uStack_38 = 3;
          local_50 = 0;
          uStack_48 = 3;
          getter.tag._0_4_ = 3;
          getter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
          getter.tag._4_4_ = 0;
          setter.tag = 3;
          setter.u.ptr = (void *)((ulong)uStack_4c << 0x20);
          iVar8 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,0x2000);
          goto LAB_0011dc10;
        }
        goto LAB_0011dcbc;
      }
    }
LAB_0011d9f3:
    JVar12 = (JSValueUnion)(*(JSShape **)((long)JVar12.ptr + 0x18))->proto;
LAB_0011d9fb:
    if ((JSObject *)JVar12.ptr != (JSObject *)0x0) {
      pJVar2 = *(JSShape **)((long)JVar12.ptr + 0x18);
      uVar10 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      while (pr = (JSProperty *)(ulong)uVar10, uVar10 != 0) {
        ppJVar14 = &pJVar2->proto + (long)pr;
        if (*(JSAtom *)((long)&pJVar2->proto + (long)pr * 8 + 4) == prop) goto LAB_0011da40;
        uVar10 = *(uint *)ppJVar14 & 0x3ffffff;
      }
      goto LAB_0011d9e7;
    }
LAB_0011dd92:
    if (((uint)flags >> 0x10 & 1) != 0) {
      JS_SetPropertyInternal_cold_1();
      goto LAB_0011d92f;
    }
    if ((JSObject *)local_c0.ptr == (JSObject *)0x0) {
      if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2)
         ) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      pcVar11 = "not an object";
LAB_0011dd81:
      iVar7 = JS_ThrowTypeErrorOrFalse(ctx,flags,pcVar11);
      return iVar7;
    }
    bVar1 = *(byte *)((long)local_c0.ptr + 5);
    if ((bVar1 & 1) == 0) {
      if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2)
         ) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      pcVar11 = "object is not extensible";
      goto LAB_0011dd81;
    }
    if ((bVar1 & 4) == 0) {
      pJVar9 = (JSValueUnion *)add_property(ctx,(JSObject *)local_c0.ptr,prop,7);
      if (pJVar9 != (JSValueUnion *)0x0) {
        pJVar9->ptr = (void *)JVar13;
        pJVar9[1].ptr = (void *)JVar15;
        return 1;
      }
      goto LAB_0011dca5;
    }
    if (((((int)prop < 0) && ((bVar1 & 8) != 0)) && (*(short *)((long)local_c0.ptr + 6) == 2)) &&
       ((prop & 0x7fffffff) == *(uint *)((long)local_c0.ptr + 0x40))) {
      iVar7 = add_fast_array_element(ctx,(JSObject *)local_c0.ptr,val,flags);
      return iVar7;
    }
    local_60 = 0;
    uStack_58 = 3;
    local_70 = 0;
    uStack_68 = 3;
    getter_00.tag._0_4_ = 3;
    getter_00.u.ptr = (void *)((ulong)uStack_5c << 0x20);
    getter_00.tag._4_4_ = 0;
    setter_00.tag = 3;
    setter_00.u.ptr = (void *)((ulong)uStack_6c << 0x20);
    iVar8 = JS_CreateProperty(ctx,(JSObject *)local_c0.ptr,prop,val,getter_00,setter_00,
                              flags | 0x2707);
  }
  else {
    if ((int)prop < 0) {
      if (*(uint *)((long)JVar12.ptr + 0x40) <= (prop & 0x7fffffff)) {
        if ((ushort)(*(short *)((long)JVar12.ptr + 6) - 0x15U) < 9) {
LAB_0011dd2d:
          JVar18 = JS_ToNumberHintFree(ctx,val,flag);
          if ((0xfffffff4 < (uint)JVar18.tag) &&
             (iVar7 = *JVar18.u.ptr, *(int *)JVar18.u.ptr = iVar7 + -1, iVar7 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar18);
          }
          if ((uint)JVar18.tag == 6) {
            return -1;
          }
          pcVar11 = "out-of-bound numeric index";
          goto LAB_0011dd81;
        }
        goto LAB_0011d9f3;
      }
      if (local_c0.ptr == JVar12.ptr) {
        val_00.tag._0_4_ = flags;
        val_00.u.ptr = JVar15.ptr;
        val_00.tag._4_4_ = in_stack_ffffffffffffff14;
        iVar7 = JS_SetPropertyValue(ctx,this_obj,(JSValue)ZEXT416(prop & 0x7fffffff),val_00,
                                    val.u._0_4_);
        return iVar7;
      }
      goto LAB_0011dd92;
    }
    if (8 < (ushort)(*(short *)((long)JVar12.ptr + 6) - 0x15U)) goto LAB_0011d9f3;
    iVar7 = JS_AtomIsNumericIndex(ctx,prop);
    if (iVar7 == 0) goto LAB_0011d9f3;
    if (-1 < iVar7) goto LAB_0011dd2d;
LAB_0011dca5:
    iVar8 = -1;
  }
LAB_0011df14:
  if (uVar16 < 0xfffffff5) {
    return iVar8;
  }
  iVar7 = *JVar13.ptr;
  *(int *)JVar13.ptr = iVar7 + -1;
  if (1 < iVar7) {
    return iVar8;
  }
  rt = ctx->rt;
  goto LAB_0011d895;
LAB_0011da40:
  pr = *(JSProperty **)((long)JVar12.ptr + 0x20) + (long)&pr[-1].u.var_ref + 0xf;
  uVar10 = *(uint *)ppJVar14 >> 0x1a & 0xfffffff0;
  if (uVar10 != 0x30) goto LAB_0011dc3a;
  iVar7 = JS_AutoInitProperty(ctx,(JSObject *)JVar12.ptr,prop,pr,(JSShapeProperty *)ppJVar14);
  if (iVar7 != 0) goto LAB_0011d92f;
  pJVar2 = *(JSShape **)((long)JVar12.ptr + 0x18);
  uVar10 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
  while( true ) {
    pr = (JSProperty *)(ulong)uVar10;
    if (uVar10 == 0) goto LAB_0011d9e7;
    ppJVar14 = &pJVar2->proto + (long)pr;
    if (*(JSAtom *)((long)&pJVar2->proto + (long)pr * 8 + 4) == prop) break;
    uVar10 = *(uint *)ppJVar14 & 0x3ffffff;
  }
  goto LAB_0011da40;
LAB_0011dc3a:
  if (uVar10 == 0x10) {
    iVar7 = call_setter(ctx,(pr->u).getset.setter,this_obj,val,flags);
    return iVar7;
  }
  if ((*(uint *)ppJVar14 >> 0x1b & 1) == 0) {
LAB_0011dcbc:
    if ((0xfffffff4 < uVar16) && (iVar7 = *JVar13.ptr, *(int *)JVar13.ptr = iVar7 + -1, iVar7 < 2))
    {
      __JS_FreeValueRT(ctx->rt,val);
    }
    iVar7 = JS_ThrowTypeErrorReadOnly(ctx,flags,prop);
    return iVar7;
  }
  goto LAB_0011d9e7;
}

Assistant:

int JS_SetPropertyInternal(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    JSObject *p, *p1;
    JSShapeProperty *prs;
    JSProperty *pr;
    uint32_t tag;
    JSPropertyDescriptor desc;
    int ret;
#if 0
    printf("JS_SetPropertyInternal: "); print_atom(ctx, prop); printf("\n");
#endif
    tag = JS_VALUE_GET_TAG(this_obj);
    if (unlikely(tag != JS_TAG_OBJECT)) {
        switch(tag) {
        case JS_TAG_NULL:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of null", prop);
            return -1;
        case JS_TAG_UNDEFINED:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of undefined", prop);
            return -1;
        default:
            /* even on a primitive type we can have setters on the prototype */
            p = NULL;
            p1 = JS_VALUE_GET_OBJ(JS_GetPrototypePrimitive(ctx, this_obj));
            goto prototype_lookup;
        }
    }
    p = JS_VALUE_GET_OBJ(this_obj);
retry:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        if (likely((prs->flags & (JS_PROP_TMASK | JS_PROP_WRITABLE |
                                  JS_PROP_LENGTH)) == JS_PROP_WRITABLE)) {
            /* fast case */
            set_value(ctx, &pr->u.value, val);
            return TRUE;
        } else if (prs->flags & JS_PROP_LENGTH) {
            assert(p->class_id == JS_CLASS_ARRAY);
            assert(prop == JS_ATOM_length);
            return set_array_length(ctx, p, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
            return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
            /* JS_PROP_WRITABLE is always true for variable
               references, but they are write protected in module name
               spaces. */
            if (p->class_id == JS_CLASS_MODULE_NS)
                goto read_only_prop;
            set_value(ctx, pr->u.var_ref->pvalue, val);
            return TRUE;
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry (potentially useless) */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs)) {
                JS_FreeValue(ctx, val);
                return -1;
            }
            goto retry;
        } else {
            goto read_only_prop;
        }
    }

    p1 = p;
    for(;;) {
        if (p1->is_exotic) {
            if (p1->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    uint32_t idx = __JS_AtomToUInt32(prop);
                    if (idx < p1->u.array.count) {
                        if (unlikely(p == p1))
                            return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val, flags);
                        else
                            break;
                    } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                               p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                        goto typed_array_oob;
                    }
                } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                           p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_AtomIsNumericIndex(ctx, prop);
                    if (ret != 0) {
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return -1;
                        }
                    typed_array_oob:
                        val = JS_ToNumberFree(ctx, val);
                        JS_FreeValue(ctx, val);
                        if (JS_IsException(val))
                            return -1;
                        return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
                    }
                }
            } else {
                const JSClassExoticMethods *em = ctx->rt->class_array[p1->class_id].exotic;
                if (em) {
                    JSValue obj1;
                    if (em->set_property) {
                        /* set_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->set_property(ctx, obj1, prop,
                                               val, this_obj, flags);
                        JS_FreeValue(ctx, obj1);
                        JS_FreeValue(ctx, val);
                        return ret;
                    }
                    if (em->get_own_property) {
                        /* get_own_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->get_own_property(ctx, &desc,
                                                   obj1, prop);
                        JS_FreeValue(ctx, obj1);
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return ret;
                        }
                        if (ret) {
                            if (desc.flags & JS_PROP_GETSET) {
                                JSObject *setter;
                                if (JS_IsUndefined(desc.setter))
                                    setter = NULL;
                                else
                                    setter = JS_VALUE_GET_OBJ(desc.setter);
                                ret = call_setter(ctx, setter, this_obj, val, flags);
                                JS_FreeValue(ctx, desc.getter);
                                JS_FreeValue(ctx, desc.setter);
                                return ret;
                            } else {
                                JS_FreeValue(ctx, desc.value);
                                if (!(desc.flags & JS_PROP_WRITABLE))
                                    goto read_only_prop;
                                if (likely(p == p1)) {
                                    ret = JS_DefineProperty(ctx, this_obj, prop, val,
                                                            JS_UNDEFINED, JS_UNDEFINED,
                                                            JS_PROP_HAS_VALUE);
                                    JS_FreeValue(ctx, val);
                                    return ret;
                                } else {
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
        p1 = p1->shape->proto;
    prototype_lookup:
        if (!p1)
            break;

    retry2:
        prs = find_own_property(&pr, p1, prop);
        if (prs) {
            if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
            } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
                /* Instantiate property and retry (potentially useless) */
                if (JS_AutoInitProperty(ctx, p1, prop, pr, prs))
                    return -1;
                goto retry2;
            } else if (!(prs->flags & JS_PROP_WRITABLE)) {
            read_only_prop:
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, prop);
            }
        }
    }

    if (unlikely(flags & JS_PROP_NO_ADD)) {
        JS_FreeValue(ctx, val);
        JS_ThrowReferenceErrorNotDefined(ctx, prop);
        return -1;
    }

    if (unlikely(!p)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "not an object");
    }

    if (unlikely(!p->extensible)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array &&
            __JS_AtomIsTaggedInt(prop)) {
            uint32_t idx = __JS_AtomToUInt32(prop);
            if (idx == p->u.array.count) {
                /* fast case */
                return add_fast_array_element(ctx, p, val, flags);
            } else {
                goto generic_create_prop;
            }
        } else {
        generic_create_prop:
            ret = JS_CreateProperty(ctx, p, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                                    flags |
                                    JS_PROP_HAS_VALUE |
                                    JS_PROP_HAS_ENUMERABLE |
                                    JS_PROP_HAS_WRITABLE |
                                    JS_PROP_HAS_CONFIGURABLE |
                                    JS_PROP_C_W_E);
            JS_FreeValue(ctx, val);
            return ret;
        }
    }

    pr = add_property(ctx, p, prop, JS_PROP_C_W_E);
    if (unlikely(!pr)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    pr->u.value = val;
    return TRUE;
}